

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t archive_write_disk_set_group_lookup
                  (archive *_a,void *private_data,
                  _func_la_int64_t_void_ptr_char_ptr_la_int64_t *lookup_gid,
                  _func_void_void_ptr *cleanup_gid)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  wchar_t magic_test;
  archive_write_disk *a;
  _func_void_void_ptr *cleanup_gid_local;
  _func_la_int64_t_void_ptr_char_ptr_la_int64_t *lookup_gid_local;
  void *private_data_local;
  archive *_a_local;
  
  iVar3 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_set_group_lookup");
  if (iVar3 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if ((_a[1].current_code != (char *)0x0) &&
       (lVar1._0_4_ = _a[1].current_codepage, lVar1._4_4_ = _a[1].current_oemcp, lVar1 != 0)) {
      uVar2._0_4_ = _a[1].current_codepage;
      uVar2._4_4_ = _a[1].current_oemcp;
      (*(code *)_a[1].current_code)(uVar2);
    }
    _a[1].error_string.buffer_length = (size_t)lookup_gid;
    _a[1].current_code = (char *)cleanup_gid;
    *(void **)&_a[1].current_codepage = private_data;
    _a_local._4_4_ = L'\0';
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_disk_set_group_lookup(struct archive *_a,
    void *private_data,
    la_int64_t (*lookup_gid)(void *private, const char *gname, la_int64_t gid),
    void (*cleanup_gid)(void *private))
{
	struct archive_write_disk *a = (struct archive_write_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_disk_set_group_lookup");

	if (a->cleanup_gid != NULL && a->lookup_gid_data != NULL)
		(a->cleanup_gid)(a->lookup_gid_data);

	a->lookup_gid = lookup_gid;
	a->cleanup_gid = cleanup_gid;
	a->lookup_gid_data = private_data;
	return (ARCHIVE_OK);
}